

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O0

int getQuadHutCst(uint64_t low20)

{
  uint64_t *cst;
  uint64_t low20_local;
  
  for (cst = low20QuadIdeal; *cst != 0; cst = cst + 1) {
    if (*cst == low20) {
      return 1;
    }
  }
  for (cst = low20QuadClassic; *cst != 0; cst = cst + 1) {
    if (*cst == low20) {
      return 2;
    }
  }
  for (cst = low20QuadHutNormal; *cst != 0; cst = cst + 1) {
    if (*cst == low20) {
      return 3;
    }
  }
  cst = low20QuadHutBarely;
  while( true ) {
    if (*cst == 0) {
      return 0;
    }
    if (*cst == low20) break;
    cst = cst + 1;
  }
  return 4;
}

Assistant:

int getQuadHutCst(uint64_t low20)
{
    const uint64_t *cst;
    for (cst = low20QuadIdeal; *cst; cst++)
        if (*cst == low20)
            return CST_IDEAL;
    for (cst = low20QuadClassic; *cst; cst++)
        if (*cst == low20)
            return CST_CLASSIC;
    for (cst = low20QuadHutNormal; *cst; cst++)
        if (*cst == low20)
            return CST_NORMAL;
    for (cst = low20QuadHutBarely; *cst; cst++)
        if (*cst == low20)
            return CST_BARELY;
    return CST_NONE;
}